

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v8::detail::default_arg_formatter<wchar_t>::operator()
          (default_arg_formatter<wchar_t> *this,longdouble value)

{
  basic_format_specs<wchar_t> specs;
  long lVar1;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar2;
  byte bStack_15;
  uint uStack_4;
  
  uStack_4 = CONCAT31(uStack_4._1_3_,1);
  specs.fill.data_[0] = 0x20;
  specs._8_4_ = (uint)bStack_15 << 0x18;
  lVar1 = (ulong)uStack_4 << 0x20;
  specs.width = 0;
  specs.precision = -1;
  specs.fill.data_[1] = L'\0';
  specs.fill.data_[2] = L'\0';
  specs.fill.data_[3] = (int)lVar1;
  specs.fill.size_ = (char)((ulong)lVar1 >> 0x20);
  specs.fill._17_3_ = (int3)((ulong)lVar1 >> 0x28);
  bVar2 = write<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_long_double,_0>
                    ((this->out).container,value,specs,(locale_ref)0x0);
  return (iterator)bVar2.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }